

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

bool __thiscall
slang::IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u>::iterator::
overflow<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,false>>
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  iterator *piVar1;
  uint32_t uVar2;
  unsigned_long *puVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  uintptr_t intWord;
  NodeRef NVar7;
  LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false> *pLVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  undefined4 in_register_00000034;
  uint32_t uVar14;
  uint32_t n;
  uint32_t uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint32_t curSizes [4];
  uint32_t newSizes [4];
  LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false> *nodes [4];
  interval<unsigned_long> ival;
  uint32_t local_c8 [6];
  iterator *local_b0;
  uint32_t local_a8 [4];
  IndexPair local_98;
  PointerIntPair<void_*,_6U,_6U,_unsigned_int> local_90;
  ulong local_88;
  ulong local_80;
  allocator_type *local_78;
  iterator *local_70;
  ulong local_68 [4];
  ulong local_48;
  interval<unsigned_long> local_40;
  
  local_80 = CONCAT44(in_register_00000034,level);
  piVar1 = this + 8;
  lVar16 = (ulong)level * 0x10;
  uVar14 = *(uint32_t *)(*(long *)(this + 8) + 0xc + lVar16);
  local_78 = alloc;
  local_70 = this;
  local_90.value = (uintptr_t)IntervalMapDetails::Path::getLeftSibling((Path *)piVar1,level);
  if (local_90.value == 0) {
    uVar15 = 0;
  }
  else {
    uVar9 = (uint)local_90.value & 0x3f;
    uVar15 = uVar9 + 1;
    uVar14 = uVar14 + uVar9 + 1;
    local_68[0] = local_90.value & 0xffffffffffffffc0;
    local_c8[0] = uVar15;
  }
  bVar5 = local_90.value != 0;
  lVar10 = *(long *)piVar1;
  uVar2 = *(uint32_t *)(lVar10 + 8 + lVar16);
  local_c8[bVar5] = uVar2;
  uVar15 = uVar15 + uVar2;
  uVar12 = bVar5 + 1;
  local_68[bVar5] = *(ulong *)(lVar10 + lVar16);
  NVar7 = IntervalMapDetails::Path::getRightSibling((Path *)piVar1,(uint32_t)local_80);
  uVar9 = uVar12;
  if (NVar7.pip.value != 0) {
    uVar9 = (uint)NVar7.pip.value & 0x3f;
    local_c8[uVar12] = uVar9 + 1;
    uVar15 = uVar15 + uVar9 + 1;
    uVar9 = bVar5 | 2;
    local_68[uVar12] = (ulong)NVar7.pip.value & 0xffffffffffffffc0;
  }
  local_88 = 0;
  local_b0 = piVar1;
  if (uVar9 * 8 < uVar15 + 1) {
    uVar12 = uVar9 - 1;
    if (uVar9 == 1) {
      uVar12 = 1;
    }
    uVar17 = (ulong)uVar12;
    local_c8[uVar9] = local_c8[uVar17];
    local_68[uVar9] = local_68[uVar17];
    local_c8[uVar17] = 0;
    pLVar8 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)local_78);
    local_68[uVar17] = (ulong)pLVar8;
    uVar9 = uVar9 + 1;
    local_88 = uVar17;
  }
  local_98 = IntervalMapDetails::distribute(uVar9,uVar15,8,local_a8,uVar14);
  if (uVar9 - 1 != 0) {
    uVar17 = (ulong)(uVar9 - 1);
    iVar13 = uVar9 - 2;
    local_48 = uVar17;
    do {
      iVar4 = iVar13;
      if (local_c8[uVar17] != local_a8[uVar17]) {
        do {
          if (iVar4 == -1) break;
          uVar14 = local_c8[iVar4];
          iVar6 = IntervalMapDetails::
                  NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                  ::adjustFromLeftSib((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                                       *)local_68[uVar17],local_c8[uVar17],
                                      (NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                                       *)local_68[iVar4],uVar14,local_a8[uVar17] - local_c8[uVar17])
          ;
          local_c8[iVar4] = uVar14 - iVar6;
          uVar14 = local_c8[uVar17];
          local_c8[uVar17] = iVar6 + uVar14;
          iVar4 = iVar4 + -1;
        } while (iVar6 + uVar14 < local_a8[uVar17]);
      }
      uVar19 = local_48;
      uVar17 = uVar17 - 1;
      iVar13 = iVar13 + -1;
    } while ((int)uVar17 != 0);
    uVar18 = 1;
    uVar17 = 0;
    do {
      uVar11 = uVar18;
      if (local_c8[uVar17] != local_a8[uVar17]) {
        do {
          if (uVar9 <= uVar11) break;
          uVar14 = local_c8[uVar11];
          iVar13 = IntervalMapDetails::
                   NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                   ::adjustFromLeftSib((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                                        *)local_68[uVar11],uVar14,
                                       (NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                                        *)local_68[uVar17],local_c8[uVar17],
                                       local_c8[uVar17] - local_a8[uVar17]);
          local_c8[uVar11] = uVar14 + iVar13;
          uVar14 = local_c8[uVar17];
          local_c8[uVar17] = uVar14 - iVar13;
          uVar11 = uVar11 + 1;
        } while (uVar14 - iVar13 < local_a8[uVar17]);
      }
      uVar17 = uVar17 + 1;
      uVar18 = uVar18 + 1;
    } while (uVar17 != uVar19);
  }
  uVar17 = local_80;
  if (local_90.value != 0) {
    IntervalMapDetails::Path::moveLeft((Path *)local_b0,(uint32_t)local_80);
  }
  local_90.value = local_88 & 0xffffffff;
  uVar18 = (ulong)local_98 & 0xffffffff;
  bVar5 = false;
  uVar19 = 0;
  while( true ) {
    uVar14 = (uint32_t)uVar17;
    if (uVar19 == local_90.value && (int)local_88 != 0) {
      puVar3 = (unsigned_long *)local_68[uVar19];
      uVar12 = local_a8[uVar19];
      local_40.right = puVar3[1];
      if (1 < (ulong)uVar12) {
        lVar16 = 0;
        do {
          uVar17 = *(ulong *)((long)puVar3 + lVar16 + 0x18);
          if (local_40.right <= uVar17) {
            local_40.right = uVar17;
          }
          lVar16 = lVar16 + 0x10;
        } while ((ulong)uVar12 * 0x10 + -0x10 != lVar16);
      }
      local_40.left = *puVar3;
      bVar5 = IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator::insertNode
                        ((iterator *)local_70,uVar14,
                         (NodeRef)((ulong)puVar3 & 0xffffffffffffffc0 | (ulong)(uVar12 - 1)),
                         &local_40,local_78);
      uVar17 = (ulong)(uVar14 + bVar5);
    }
    else {
      uVar15 = local_a8[uVar19];
      lVar16 = *(long *)local_b0;
      *(uint32_t *)(lVar16 + 8 + (uVar17 & 0xffffffff) * 0x10) = uVar15;
      if (uVar14 != 0) {
        lVar10 = (ulong)(uVar14 - 1) * 0x10;
        uVar11 = (ulong)*(uint *)(lVar16 + 0xc + lVar10);
        lVar16 = *(long *)(lVar16 + lVar10);
        *(ulong *)(lVar16 + uVar11 * 8) =
             *(ulong *)(lVar16 + uVar11 * 8) & 0xffffffffffffffc0 | (ulong)(uVar15 - 1);
      }
      IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator::recomputeBounds
                ((iterator *)local_70,uVar14);
    }
    piVar1 = local_b0;
    if (uVar19 + 1 == (ulong)uVar9) break;
    IntervalMapDetails::Path::moveRight((Path *)local_b0,(uint32_t)uVar17);
    uVar18 = (ulong)((int)uVar18 - 1);
    uVar19 = uVar19 + 1;
  }
  if ((uint)uVar19 != local_98.first) {
    do {
      IntervalMapDetails::Path::moveLeft((Path *)piVar1,(uint32_t)uVar17);
      uVar9 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar9;
    } while (uVar9 != 0);
  }
  *(uint *)(*(long *)piVar1 + 0xc + (uVar17 & 0xffffffff) * 0x10) = local_98.second;
  return bVar5;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::overflow(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    using namespace IntervalMapDetails;

    auto& path = this->path;
    uint32_t offset = path.offset(level);
    uint32_t numElems = 0;
    uint32_t numNodes = 0;
    TNode* nodes[4];
    uint32_t curSizes[4];

    // Handle left sibling, if it exists.
    NodeRef leftSib = path.getLeftSibling(level);
    if (leftSib) {
        numElems = curSizes[0] = leftSib.size();
        offset += numElems;
        nodes[numNodes++] = &leftSib.get<TNode>();
    }

    // Handle the current node.
    numElems += curSizes[numNodes] = path.size(level);
    nodes[numNodes++] = &path.template node<TNode>(level);

    // Handle right sibling, if it exists.
    NodeRef rightSib = path.getRightSibling(level);
    if (rightSib) {
        numElems += curSizes[numNodes] = rightSib.size();
        nodes[numNodes++] = &rightSib.get<TNode>();
    }

    // Check if we need to allocate a new node.
    uint32_t newNode = 0;
    if (numElems + 1 > numNodes * TNode::Capacity) {
        // Insert new node at the penultimate position, or after a single node if only one.
        newNode = numNodes == 1 ? 1 : numNodes - 1;
        curSizes[numNodes] = curSizes[newNode];
        nodes[numNodes] = nodes[newNode];
        curSizes[newNode] = 0;
        nodes[newNode] = alloc.template emplace<TNode>();
        numNodes++;
    }

    // Redistribute elements among the nodes.
    uint32_t newSizes[4];
    IndexPair newOffset = distribute(numNodes, numElems, TNode::Capacity, newSizes, offset);

    // Move elements right.
    for (uint32_t n = numNodes - 1; n; --n) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (int m = int(n - 1); m != -1; --m) {
            int delta = nodes[n]->adjustFromLeftSib(curSizes[n], *nodes[m], curSizes[m],
                                                    int(newSizes[n]) - int(curSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) - delta);
            curSizes[n] = uint32_t(int(curSizes[n]) + delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move elements left.
    for (uint32_t n = 0; n < numNodes - 1; n++) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (uint32_t m = n + 1; m < numNodes; m++) {
            int delta = nodes[m]->adjustFromLeftSib(curSizes[m], *nodes[n], curSizes[n],
                                                    int(curSizes[n]) - int(newSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) + delta);
            curSizes[n] = uint32_t(int(curSizes[n]) - delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move the path to the leftmost node.
    if (leftSib)
        path.moveLeft(level);

    // Elements have been moved, update node sizes and interval bounds.
    bool split = false;
    uint32_t pos = 0;
    while (true) {
        if (newNode && pos == newNode) {
            // Actually insert the new node that we created earlier.
            auto ival = nodes[pos]->getBounds(newSizes[pos]);
            split = insertNode(level, NodeRef(nodes[pos], newSizes[pos]), ival, alloc);
            if (split)
                level++;
        }
        else {
            // Otherwise just update the size and bounds.
            path.setSize(level, newSizes[pos]);
            recomputeBounds(level);
        }

        if (pos + 1 == numNodes)
            break;

        path.moveRight(level);
        ++pos;
    }

    // Move our path to the new offset of the element we used to be pointing at.
    while (pos != newOffset.first) {
        path.moveLeft(level);
        --pos;
    }

    path.offset(level) = newOffset.second;
    return split;
}